

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_spec.cpp
# Opt level: O2

void parseExternalPalSpec(char *arg)

{
  bool bVar1;
  char *pcVar2;
  long lVar3;
  ulong uVar4;
  long lStack_140;
  char *ptr;
  char *arg_local;
  filebuf file;
  
  arg_local = arg;
  pcVar2 = strchr(arg,0x3a);
  if (pcVar2 == (char *)0x0) {
    error("External palette spec must have format `fmt:path` (missing colon)");
    return;
  }
  _file = &arg_local;
  lStack_140 = 0;
  do {
    if (lStack_140 == 0x60) {
      bVar1 = __gnu_cxx::__ops::_Iter_pred<parseExternalPalSpec(char_const*)::$_0>::operator()
                        ((_Iter_pred<parseExternalPalSpec(char_const*)::__0> *)&file,
                         parseExternalPalSpec::parsers._M_elems + 4);
      if (bVar1) {
        lStack_140 = 0x60;
      }
      else {
        bVar1 = __gnu_cxx::__ops::_Iter_pred<parseExternalPalSpec(char_const*)::$_0>::operator()
                          ((_Iter_pred<parseExternalPalSpec(char_const*)::__0> *)&file,
                           parseExternalPalSpec::parsers._M_elems + 5);
        if (!bVar1) {
LAB_0010bb92:
          uVar4 = (long)pcVar2 - (long)arg;
          if (0x7ffffffe < (long)uVar4) {
            uVar4 = 0x7fffffff;
          }
          error("Unknown external palette format \"%.*s\"",uVar4 & 0xffffffff,arg);
          return;
        }
        lStack_140 = 0x78;
      }
LAB_0010bb34:
      std::filebuf::filebuf(&file);
      lVar3 = std::filebuf::open((char *)&file,(_Ios_Openmode)(pcVar2 + 1));
      if (lVar3 == 0) {
        error("Failed to open palette file \"%s\"",pcVar2 + 1);
      }
      else {
        (**(code **)((long)&parseExternalPalSpec::parsers._M_elems[0].
                            super__Tuple_impl<0UL,_const_char_*,_void_(*)(std::basic_filebuf<char,_std::char_traits<char>_>_&),_std::_Ios_Openmode>
                            .
                            super__Tuple_impl<1UL,_void_(*)(std::basic_filebuf<char,_std::char_traits<char>_>_&),_std::_Ios_Openmode>
                            .
                            super__Head_base<1UL,_void_(*)(std::basic_filebuf<char,_std::char_traits<char>_>_&),_false>
                            ._M_head_impl + lStack_140))(&file);
      }
      std::filebuf::~filebuf(&file);
      return;
    }
    bVar1 = __gnu_cxx::__ops::_Iter_pred<parseExternalPalSpec(char_const*)::$_0>::operator()
                      ((_Iter_pred<parseExternalPalSpec(char_const*)::__0> *)&file,
                       (tuple<const_char_*,_void_(*)(std::basic_filebuf<char,_std::char_traits<char>_>_&),_std::_Ios_Openmode>
                        *)((long)&parseExternalPalSpec::parsers._M_elems[0].
                                  super__Tuple_impl<0UL,_const_char_*,_void_(*)(std::basic_filebuf<char,_std::char_traits<char>_>_&),_std::_Ios_Openmode>
                                  .
                                  super__Tuple_impl<1UL,_void_(*)(std::basic_filebuf<char,_std::char_traits<char>_>_&),_std::_Ios_Openmode>
                                  .super__Tuple_impl<2UL,_std::_Ios_Openmode>.
                                  super__Head_base<2UL,_std::_Ios_Openmode,_false>._M_head_impl +
                          lStack_140));
    if (bVar1) goto LAB_0010bb34;
    bVar1 = __gnu_cxx::__ops::_Iter_pred<parseExternalPalSpec(char_const*)::$_0>::operator()
                      ((_Iter_pred<parseExternalPalSpec(char_const*)::__0> *)&file,
                       (tuple<const_char_*,_void_(*)(std::basic_filebuf<char,_std::char_traits<char>_>_&),_std::_Ios_Openmode>
                        *)((long)&parseExternalPalSpec::parsers._M_elems[1].
                                  super__Tuple_impl<0UL,_const_char_*,_void_(*)(std::basic_filebuf<char,_std::char_traits<char>_>_&),_std::_Ios_Openmode>
                                  .
                                  super__Tuple_impl<1UL,_void_(*)(std::basic_filebuf<char,_std::char_traits<char>_>_&),_std::_Ios_Openmode>
                                  .super__Tuple_impl<2UL,_std::_Ios_Openmode>.
                                  super__Head_base<2UL,_std::_Ios_Openmode,_false>._M_head_impl +
                          lStack_140));
    if (bVar1) {
      lStack_140 = lStack_140 + 0x18;
      goto LAB_0010bb34;
    }
    bVar1 = __gnu_cxx::__ops::_Iter_pred<parseExternalPalSpec(char_const*)::$_0>::operator()
                      ((_Iter_pred<parseExternalPalSpec(char_const*)::__0> *)&file,
                       (tuple<const_char_*,_void_(*)(std::basic_filebuf<char,_std::char_traits<char>_>_&),_std::_Ios_Openmode>
                        *)((long)&parseExternalPalSpec::parsers._M_elems[2].
                                  super__Tuple_impl<0UL,_const_char_*,_void_(*)(std::basic_filebuf<char,_std::char_traits<char>_>_&),_std::_Ios_Openmode>
                                  .
                                  super__Tuple_impl<1UL,_void_(*)(std::basic_filebuf<char,_std::char_traits<char>_>_&),_std::_Ios_Openmode>
                                  .super__Tuple_impl<2UL,_std::_Ios_Openmode>.
                                  super__Head_base<2UL,_std::_Ios_Openmode,_false>._M_head_impl +
                          lStack_140));
    if (bVar1) {
      if (lStack_140 == 0x60) goto LAB_0010bb92;
      lStack_140 = lStack_140 + 0x30;
      goto LAB_0010bb34;
    }
    bVar1 = __gnu_cxx::__ops::_Iter_pred<parseExternalPalSpec(char_const*)::$_0>::operator()
                      ((_Iter_pred<parseExternalPalSpec(char_const*)::__0> *)&file,
                       (tuple<const_char_*,_void_(*)(std::basic_filebuf<char,_std::char_traits<char>_>_&),_std::_Ios_Openmode>
                        *)((long)&parseExternalPalSpec::parsers._M_elems[3].
                                  super__Tuple_impl<0UL,_const_char_*,_void_(*)(std::basic_filebuf<char,_std::char_traits<char>_>_&),_std::_Ios_Openmode>
                                  .
                                  super__Tuple_impl<1UL,_void_(*)(std::basic_filebuf<char,_std::char_traits<char>_>_&),_std::_Ios_Openmode>
                                  .super__Tuple_impl<2UL,_std::_Ios_Openmode>.
                                  super__Head_base<2UL,_std::_Ios_Openmode,_false>._M_head_impl +
                          lStack_140));
    if (bVar1) {
      lStack_140 = lStack_140 + 0x48;
      goto LAB_0010bb34;
    }
    lStack_140 = lStack_140 + 0x60;
  } while( true );
}

Assistant:

void parseExternalPalSpec(char const *arg) {
	// `fmt:path`, parse the file according to the given format

	// Split both parts, error out if malformed
	char const *ptr = strchr(arg, ':');
	if (ptr == nullptr) {
		error("External palette spec must have format `fmt:path` (missing colon)");
		return;
	}
	char const *path = ptr + 1;

	static std::array parsers{
	    std::tuple{"PSP", &parsePSPFile, std::ios::in    },
	    std::tuple{"GPL", &parseGPLFile, std::ios::in    },
	    std::tuple{"HEX", &parseHEXFile, std::ios::in    },
	    std::tuple{"ACT", &parseACTFile, std::ios::binary},
	    std::tuple{"ACO", &parseACOFile, std::ios::binary},
	    std::tuple{"GBC", &parseGBCFile, std::ios::binary},
	};

	auto iter = std::find_if(parsers.begin(), parsers.end(),
	                         [&arg, &ptr](decltype(parsers)::value_type const &parser) {
		                         return strncasecmp(arg, std::get<0>(parser), ptr - arg) == 0;
	                         });
	if (iter == parsers.end()) {
		error("Unknown external palette format \"%.*s\"",
		      static_cast<int>(std::min(ptr - arg, static_cast<decltype(ptr - arg)>(INT_MAX))),
		      arg);
		return;
	}

	std::filebuf file;
	// Some parsers read the file in text mode, others in binary mode
	if (!file.open(path, std::ios::in | std::get<2>(*iter))) {
		error("Failed to open palette file \"%s\"", path);
		return;
	}

	std::get<1> (*iter)(file);
}